

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
CopyAttributeIntoNode(UA_Server *server,UA_Session *session,UA_Node *node,UA_WriteValue *wvalue)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  UA_LocalizedText *src;
  UA_Logger logger;
  UA_Boolean UVar12;
  char *pcVar13;
  uint local_80;
  uint local_78;
  uint local_74;
  UA_StatusCode local_5c;
  UA_StatusCode retval;
  void *value;
  UA_WriteValue *wvalue_local;
  UA_Node *node_local;
  UA_Session *session_local;
  UA_Server *server_local;
  
  src = (UA_LocalizedText *)(wvalue->value).value.data;
  local_5c = 0;
  switch(wvalue->attributeId) {
  case 1:
  case 2:
    local_5c = 0x80730000;
    break;
  case 3:
    if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
          (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x160710)) ||
       (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      UA_QualifiedName_deleteMembers(&node->browseName);
      UA_QualifiedName_copy((UA_QualifiedName *)src,&node->browseName);
    }
    break;
  case 4:
    if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
          (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x160740)) ||
       (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      UA_LocalizedText_deleteMembers(&node->displayName);
      UA_LocalizedText_copy(src,&node->displayName);
    }
    break;
  case 5:
    if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
          (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x160740)) ||
       (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      UA_LocalizedText_deleteMembers(&node->description);
      UA_LocalizedText_copy(src,&node->description);
    }
    break;
  case 6:
    if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
          (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x1604a0)) ||
       (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      node->writeMask = (UA_UInt32)(src->locale).length;
    }
    break;
  case 7:
    if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
          (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x1604a0)) ||
       (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      node->userWriteMask = (UA_UInt32)(src->locale).length;
    }
    break;
  case 8:
    if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
          (undefined1  [96])0x0) || ((wvalue->value).value.type != UA_TYPES)) ||
       (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      local_5c = writeIsAbstractAttribute(node,(UA_Boolean)((byte)(src->locale).length & 1));
    }
    break;
  case 9:
    if ((node->nodeClass & UA_NODECLASS_REFERENCETYPE) == UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != UA_TYPES)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      *(byte *)((long)&node[1].nodeId.namespaceIndex + 1) = (byte)(src->locale).length & 1;
    }
    break;
  case 10:
    if ((node->nodeClass & UA_NODECLASS_REFERENCETYPE) == UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x160740)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      UA_LocalizedText_deleteMembers((UA_LocalizedText *)&node[1].nodeId.identifier.string);
      UA_LocalizedText_copy(src,(UA_LocalizedText *)&node[1].nodeId.identifier.string);
    }
    break;
  case 0xb:
    if ((node->nodeClass & UA_NODECLASS_VIEW) == UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != UA_TYPES)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      *(byte *)((long)&node[1].nodeId.namespaceIndex + 1) = (byte)(src->locale).length & 1;
    }
    break;
  case 0xc:
    if ((node->nodeClass & (UA_NODECLASS_VIEW|UA_NODECLASS_OBJECT)) == UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x1603e0)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      *(char *)&node[1].nodeId.namespaceIndex = (char)(src->locale).length;
    }
    break;
  case 0xd:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else {
      local_5c = writeValueAttribute(server,(UA_VariableNode *)node,&wvalue->value,
                                     &wvalue->indexRange);
    }
    break;
  case 0xe:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x160680)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      local_5c = writeDataTypeAttributeWithVT(server,(UA_VariableNode *)node,(UA_NodeId *)src);
    }
    break;
  case 0xf:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x160470)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      local_5c = writeValueRankAttributeWithVT
                           (server,(UA_VariableNode *)node,(UA_Int32)(src->locale).length);
    }
    break;
  case 0x10:
    if ((node->nodeClass & (UA_NODECLASS_VARIABLETYPE|UA_NODECLASS_VARIABLE)) ==
        UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x1604a0)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      local_5c = writeArrayDimensionsAttribute
                           (server,(UA_VariableNode *)node,(wvalue->value).value.arrayLength,
                            (UA_UInt32 *)(wvalue->value).value.data);
    }
    break;
  case 0x11:
    if ((node->nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x1603e0)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      *(char *)&node[2].browseName.namespaceIndex = (char)(src->locale).length;
    }
    break;
  case 0x12:
    if ((node->nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x1603e0)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      *(char *)((long)&node[2].browseName.namespaceIndex + 1) = (char)(src->locale).length;
    }
    break;
  case 0x13:
    if ((node->nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != (UA_DataType *)0x160560)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      node[2].browseName.name.length = (src->locale).length;
    }
    break;
  case 0x14:
    if ((node->nodeClass & UA_NODECLASS_VARIABLE) == UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != UA_TYPES)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      *(byte *)&node[2].browseName.name.data = (byte)(src->locale).length & 1;
    }
    break;
  case 0x15:
    if ((node->nodeClass & UA_NODECLASS_METHOD) == UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != UA_TYPES)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      *(byte *)&node[1].nodeId.namespaceIndex = (byte)(src->locale).length & 1;
    }
    break;
  case 0x16:
    if ((node->nodeClass & UA_NODECLASS_METHOD) == UA_NODECLASS_UNSPECIFIED) {
      local_5c = 0x805f0000;
    }
    else if ((((undefined1  [96])((undefined1  [96])wvalue->value & (undefined1  [96])0x1) ==
               (undefined1  [96])0x0) || ((wvalue->value).value.type != UA_TYPES)) ||
            (UVar12 = UA_Variant_isScalar(&(wvalue->value).value), !UVar12)) {
      local_5c = 0x80740000;
    }
    else {
      *(byte *)((long)&node[1].nodeId.namespaceIndex + 1) = (byte)(src->locale).length & 1;
    }
    break;
  default:
    local_5c = 0x80350000;
  }
  if (local_5c != 0) {
    logger = (server->config).logger;
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_78 = 0;
    }
    else {
      if (session->channel->connection == (UA_Connection *)0x0) {
        local_74 = 0;
      }
      else {
        local_74 = session->channel->connection->sockfd;
      }
      local_78 = local_74;
    }
    if (session->channel == (UA_SecureChannel *)0x0) {
      local_80 = 0;
    }
    else {
      local_80 = (session->channel->securityToken).channelId;
    }
    uVar11 = (session->sessionId).identifier.numeric;
    uVar9 = (session->sessionId).identifier.guid.data2;
    uVar10 = (session->sessionId).identifier.guid.data3;
    bVar1 = (session->sessionId).identifier.guid.data4[0];
    bVar2 = (session->sessionId).identifier.guid.data4[1];
    bVar3 = (session->sessionId).identifier.guid.data4[2];
    bVar4 = (session->sessionId).identifier.guid.data4[3];
    bVar5 = (session->sessionId).identifier.guid.data4[4];
    bVar6 = (session->sessionId).identifier.guid.data4[5];
    bVar7 = (session->sessionId).identifier.guid.data4[6];
    bVar8 = (session->sessionId).identifier.guid.data4[7];
    pcVar13 = UA_StatusCode_name(local_5c);
    UA_LOG_INFO(logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | WriteRequest returned status code %s"
                ,(ulong)local_78,(ulong)local_80,(ulong)uVar11,(uint)uVar9,(uint)uVar10,(uint)bVar1,
                (uint)bVar2,(uint)bVar3,(uint)bVar4,(uint)bVar5,(uint)bVar6,(uint)bVar7,(uint)bVar8,
                pcVar13);
  }
  return local_5c;
}

Assistant:

static UA_StatusCode
CopyAttributeIntoNode(UA_Server *server, UA_Session *session,
                      UA_Node *node, const UA_WriteValue *wvalue) {
    const void *value = wvalue->value.value.data;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch(wvalue->attributeId) {
    case UA_ATTRIBUTEID_NODEID:
    case UA_ATTRIBUTEID_NODECLASS:
        retval = UA_STATUSCODE_BADWRITENOTSUPPORTED;
        break;
    case UA_ATTRIBUTEID_BROWSENAME:
        CHECK_DATATYPE_SCALAR(QUALIFIEDNAME);
        UA_QualifiedName_deleteMembers(&node->browseName);
        UA_QualifiedName_copy(value, &node->browseName);
        break;
    case UA_ATTRIBUTEID_DISPLAYNAME:
        CHECK_DATATYPE_SCALAR(LOCALIZEDTEXT);
        UA_LocalizedText_deleteMembers(&node->displayName);
        UA_LocalizedText_copy(value, &node->displayName);
        break;
    case UA_ATTRIBUTEID_DESCRIPTION:
        CHECK_DATATYPE_SCALAR(LOCALIZEDTEXT);
        UA_LocalizedText_deleteMembers(&node->description);
        UA_LocalizedText_copy(value, &node->description);
        break;
    case UA_ATTRIBUTEID_WRITEMASK:
        CHECK_DATATYPE_SCALAR(UINT32);
        node->writeMask = *(const UA_UInt32*)value;
        break;
    case UA_ATTRIBUTEID_USERWRITEMASK:
        CHECK_DATATYPE_SCALAR(UINT32);
        node->userWriteMask = *(const UA_UInt32*)value;
        break;
    case UA_ATTRIBUTEID_ISABSTRACT:
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        retval = writeIsAbstractAttribute(node, *(const UA_Boolean*)value);
        break;
    case UA_ATTRIBUTEID_SYMMETRIC:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_REFERENCETYPE);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_ReferenceTypeNode*)node)->symmetric = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_INVERSENAME:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_REFERENCETYPE);
        CHECK_DATATYPE_SCALAR(LOCALIZEDTEXT);
        UA_LocalizedText_deleteMembers(&((UA_ReferenceTypeNode*)node)->inverseName);
        UA_LocalizedText_copy(value, &((UA_ReferenceTypeNode*)node)->inverseName);
        break;
    case UA_ATTRIBUTEID_CONTAINSNOLOOPS:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VIEW);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_ViewNode*)node)->containsNoLoops = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_EVENTNOTIFIER:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VIEW | UA_NODECLASS_OBJECT);
        CHECK_DATATYPE_SCALAR(BYTE);
        ((UA_ViewNode*)node)->eventNotifier = *(const UA_Byte*)value;
        break;
    case UA_ATTRIBUTEID_VALUE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        retval = writeValueAttribute(server, (UA_VariableNode*)node,
                                     &wvalue->value, &wvalue->indexRange);
        break;
    case UA_ATTRIBUTEID_DATATYPE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        CHECK_DATATYPE_SCALAR(NODEID);
        retval = writeDataTypeAttributeWithVT(server, (UA_VariableNode*)node, (const UA_NodeId*)value);
        break;
    case UA_ATTRIBUTEID_VALUERANK:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        CHECK_DATATYPE_SCALAR(INT32);
        retval = writeValueRankAttributeWithVT(server, (UA_VariableNode*)node, *(const UA_Int32*)value);
        break;
    case UA_ATTRIBUTEID_ARRAYDIMENSIONS:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        CHECK_DATATYPE_ARRAY(UINT32);
        retval = writeArrayDimensionsAttribute(server, (UA_VariableNode*)node,
                                               wvalue->value.value.arrayLength,
                                               wvalue->value.value.data);
        break;
    case UA_ATTRIBUTEID_ACCESSLEVEL:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(BYTE);
        ((UA_VariableNode*)node)->accessLevel = *(const UA_Byte*)value;
        break;
    case UA_ATTRIBUTEID_USERACCESSLEVEL:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(BYTE);
        ((UA_VariableNode*)node)->userAccessLevel = *(const UA_Byte*)value;
        break;
    case UA_ATTRIBUTEID_MINIMUMSAMPLINGINTERVAL:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(DOUBLE);
        ((UA_VariableNode*)node)->minimumSamplingInterval = *(const UA_Double*)value;
        break;
    case UA_ATTRIBUTEID_HISTORIZING:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_VARIABLE);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_VariableNode*)node)->historizing = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_EXECUTABLE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_METHOD);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_MethodNode*)node)->executable = *(const UA_Boolean*)value;
        break;
    case UA_ATTRIBUTEID_USEREXECUTABLE:
        CHECK_NODECLASS_WRITE(UA_NODECLASS_METHOD);
        CHECK_DATATYPE_SCALAR(BOOLEAN);
        ((UA_MethodNode*)node)->userExecutable = *(const UA_Boolean*)value;
        break;
    default:
        retval = UA_STATUSCODE_BADATTRIBUTEIDINVALID;
        break;
    }
    if(retval != UA_STATUSCODE_GOOD)
        UA_LOG_INFO_SESSION(server->config.logger, session,
                            "WriteRequest returned status code %s",
                            UA_StatusCode_name(retval));
    return retval;
}